

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int uv__udp_set_membership4
              (uv_udp_t *handle,sockaddr_in *multicast_addr,char *interface_addr,
              uv_membership membership)

{
  int iVar1;
  int *piVar2;
  int local_38;
  int err;
  int optname;
  ip_mreq mreq;
  uv_membership membership_local;
  char *interface_addr_local;
  sockaddr_in *multicast_addr_local;
  uv_udp_t *handle_local;
  
  mreq.imr_multiaddr.s_addr = membership;
  unique0x100000ea = interface_addr;
  memset(&err,0,8);
  if (stack0xffffffffffffffd8 == (char *)0x0) {
    optname = htonl(0);
  }
  else {
    iVar1 = uv_inet_pton(2,stack0xffffffffffffffd8,&optname);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  err = (multicast_addr->sin_addr).s_addr;
  if (mreq.imr_multiaddr.s_addr == 0) {
    local_38 = 0x24;
  }
  else {
    if (mreq.imr_multiaddr.s_addr != 1) {
      return -0x16;
    }
    local_38 = 0x23;
  }
  iVar1 = setsockopt((handle->io_watcher).fd,0,local_38,&err,8);
  if (iVar1 == 0) {
    handle_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    handle_local._4_4_ = -*piVar2;
  }
  return handle_local._4_4_;
}

Assistant:

static int uv__udp_set_membership4(uv_udp_t* handle,
                                   const struct sockaddr_in* multicast_addr,
                                   const char* interface_addr,
                                   uv_membership membership) {
  struct ip_mreq mreq;
  int optname;
  int err;

  memset(&mreq, 0, sizeof mreq);

  if (interface_addr) {
    err = uv_inet_pton(AF_INET, interface_addr, &mreq.imr_interface.s_addr);
    if (err)
      return err;
  } else {
    mreq.imr_interface.s_addr = htonl(INADDR_ANY);
  }

  mreq.imr_multiaddr.s_addr = multicast_addr->sin_addr.s_addr;

  switch (membership) {
  case UV_JOIN_GROUP:
    optname = IP_ADD_MEMBERSHIP;
    break;
  case UV_LEAVE_GROUP:
    optname = IP_DROP_MEMBERSHIP;
    break;
  default:
    return -EINVAL;
  }

  if (setsockopt(handle->io_watcher.fd,
                 IPPROTO_IP,
                 optname,
                 &mreq,
                 sizeof(mreq))) {
#if defined(__MVS__)
  if (errno == ENXIO)
    return -ENODEV;
#endif
    return -errno;
  }

  return 0;
}